

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O2

void * log_map_get(log_map map,char *key)

{
  log_map_bucket_conflict plVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  log_map_bucket plVar5;
  
  sVar3 = log_map_hash_fnv1(key);
  plVar1 = (map->table).data;
  uVar4 = (map->table).size - 1 & sVar3;
  if (plVar1[uVar4].key != (char *)0x0) {
    plVar5 = plVar1 + uVar4;
    do {
      iVar2 = strcmp(plVar5->key,key);
      if (iVar2 == 0) {
        return plVar5->value;
      }
      plVar5 = plVar5->next;
    } while (plVar5 != (log_map_bucket)0x0);
  }
  return (void *)0x0;
}

Assistant:

const void *log_map_get(log_map map, const char *key)
{
	size_t hash = log_map_hash_fnv1(key) & (map->table.size - 1);

	log_map_bucket bucket = &map->table.data[hash];

	if (bucket->key != NULL)
	{
		do
		{
			if (strcmp(bucket->key, key) == 0)
			{
				return bucket->value;
			}

			bucket = bucket->next;

		} while (bucket != NULL);
	}

	return NULL;
}